

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::parseDumpLine(DumpReader *this,string *line)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  double *pdVar5;
  long in_RDI;
  RealType RVar6;
  _func_int **pp_Var7;
  RigidBody *rb;
  RealType density;
  RealType sPot;
  Vector3d eField;
  RealType flucQFrc;
  RealType flucQVel;
  RealType flucQPos;
  RealType particlePot;
  Vector3d torque;
  Vector3d force;
  Vector3d ji;
  RealType qlen;
  Quat4d q;
  Vector3d vel;
  Vector3d pos;
  int i;
  size_t found;
  int size;
  string type;
  StuntDouble *sd;
  int index;
  int nTokens;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffba0;
  SimInfo *in_stack_fffffffffffffba8;
  StuntDouble *in_stack_fffffffffffffbb0;
  StringTokenizer *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  StringTokenizer *in_stack_fffffffffffffbe0;
  StuntDouble *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  StringTokenizer *in_stack_fffffffffffffc48;
  RigidBody *in_stack_fffffffffffffd30;
  Vector<double,_3U> local_1c8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  Vector<double,_3U> local_190;
  Vector<double,_3U> local_178;
  Vector<double,_3U> local_160;
  double local_148;
  RigidBody *in_stack_fffffffffffffec0;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  int local_ec;
  long local_e8;
  int local_dc;
  string local_d8 [36];
  undefined4 local_b4;
  StuntDouble *local_b0;
  uint local_a4;
  int local_a0;
  allocator<char> local_89;
  string local_88 [136];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffbe0->tokenString_,(char *)in_stack_fffffffffffffbd8,
             (allocator<char> *)in_stack_fffffffffffffbd0);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_a0 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffffbb0);
  if (local_a0 < 2) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",uVar3);
    painCave.isFatal = 1;
    simError();
  }
  local_a4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffbc0);
  local_b0 = SimInfo::getIOIndexToIntegrableObject
                       (in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  if (local_b0 == (StuntDouble *)0x0) {
    local_b4 = 1;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffc48);
    local_dc = std::__cxx11::string::size();
    if (((*(byte *)(in_RDI + 0x250) & 1) != 0) &&
       (local_e8 = std::__cxx11::string::find((char *)local_d8,0x433bba), uVar1 = local_a4,
       local_e8 == -1)) {
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: StuntDouble %d has no Position\n\tField (\"p\") specified.\n%s\n",
               (ulong)uVar1,uVar3);
      painCave.isFatal = 1;
      simError();
    }
    bVar2 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffba0);
    if (((bVar2) && ((*(byte *)(in_RDI + 0x252) & 1) != 0)) &&
       (local_e8 = std::__cxx11::string::find((char *)local_d8,0x429710), uVar1 = local_a4,
       local_e8 == -1)) {
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: Directional StuntDouble %d has no\n\tQuaternion Field (\"q\") specified.\n%s\n"
               ,(ulong)uVar1,uVar3);
      painCave.isFatal = 1;
      simError();
    }
    for (local_ec = 0; local_ec < local_dc; local_ec = local_ec + 1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_d8);
      switch(*puVar4) {
      case 99:
        local_1a0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        bVar2 = StuntDouble::isAtom(local_b0);
        if (bVar2) {
          if (local_b0 != (StuntDouble *)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          bVar2 = Atom::isFluctuatingCharge((Atom *)0x17eb21);
          if (bVar2) {
            StuntDouble::setFlucQPos(in_stack_fffffffffffffbb0,(RealType)in_stack_fffffffffffffba8);
          }
        }
        break;
      case 100:
        in_stack_fffffffffffffba8 =
             (SimInfo *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        StuntDouble::setDensity(in_stack_fffffffffffffbb0,(RealType)in_stack_fffffffffffffba8);
        break;
      case 0x65:
        Vector3<double>::Vector3((Vector3<double> *)0x17ecf9);
        in_stack_fffffffffffffbe0 =
             (StringTokenizer *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_1c8,0);
        *pdVar5 = (double)in_stack_fffffffffffffbe0;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_1c8,1);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_1c8,2);
        *pdVar5 = RVar6;
        if ((*(byte *)(in_RDI + 0x255) & 1) != 0) {
          StuntDouble::setElectricField
                    (in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
        }
        break;
      case 0x66:
        Vector3<double>::Vector3((Vector3<double> *)0x17e83a);
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_178,0);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_178,1);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_178,2);
        *pdVar5 = RVar6;
        StuntDouble::setFrc(in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
        break;
      case 0x67:
        local_1b0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffc07 = StuntDouble::isAtom(local_b0);
        if ((bool)in_stack_fffffffffffffc07) {
          in_stack_fffffffffffffbf8 = local_b0;
          if (local_b0 != (StuntDouble *)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          bVar2 = Atom::isFluctuatingCharge((Atom *)0x17ecbb);
          if (bVar2) {
            StuntDouble::setFlucQFrc(in_stack_fffffffffffffbb0,(RealType)in_stack_fffffffffffffba8);
          }
        }
        break;
      default:
        uVar3 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffba0 = &painCave;
        snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n",uVar3);
        *(undefined4 *)((long)in_stack_fffffffffffffba0->errMsg + 2000) = 1;
        simError();
        break;
      case 0x6a:
        Vector3<double>::Vector3((Vector3<double> *)0x17e6fc);
        bVar2 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffba0);
        if (bVar2) {
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_3U>::operator[](&local_160,0);
          *pdVar5 = RVar6;
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_3U>::operator[](&local_160,1);
          *pdVar5 = RVar6;
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_3U>::operator[](&local_160,2);
          *pdVar5 = RVar6;
          if ((*(byte *)(in_RDI + 0x253) & 1) != 0) {
            StuntDouble::setJ(in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
          }
        }
        break;
      case 0x70:
        Vector3<double>::Vector3((Vector3<double> *)0x17e2c0);
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_108,0);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_108,1);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_108,2);
        *pdVar5 = RVar6;
        if ((*(byte *)(in_RDI + 0x250) & 1) != 0) {
          StuntDouble::setPos(in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
        }
        break;
      case 0x71:
        Quaternion<double>::Quaternion((Quaternion<double> *)0x17e4ec);
        bVar2 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffba0);
        if (bVar2) {
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_4U>::operator[]((Vector<double,_4U> *)&stack0xfffffffffffffec0,0);
          *pdVar5 = RVar6;
          pp_Var7 = (_func_int **)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          in_stack_fffffffffffffd30 =
               (RigidBody *)
               Vector<double,_4U>::operator[]((Vector<double,_4U> *)&stack0xfffffffffffffec0,1);
          (in_stack_fffffffffffffd30->super_StuntDouble)._vptr_StuntDouble = pp_Var7;
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_4U>::operator[]((Vector<double,_4U> *)&stack0xfffffffffffffec0,2);
          *pdVar5 = RVar6;
          RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
          pdVar5 = Vector<double,_4U>::operator[]((Vector<double,_4U> *)&stack0xfffffffffffffec0,3);
          *pdVar5 = RVar6;
          local_148 = Vector<double,_4U>::length((Vector<double,_4U> *)0x17e642);
          if (local_148 < 1e-06) {
            snprintf(painCave.errMsg,2000,
                     "DumpReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n")
            ;
            painCave.isFatal = 1;
            simError();
          }
          Vector<double,_4U>::normalize((Vector<double,_4U> *)in_stack_fffffffffffffba0);
          if ((*(byte *)(in_RDI + 0x252) & 1) != 0) {
            StuntDouble::setQ((StuntDouble *)
                              CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                              (Quat4d *)in_stack_fffffffffffffbf8);
          }
        }
        break;
      case 0x73:
        in_stack_fffffffffffffbb0 =
             (StuntDouble *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        StuntDouble::setSitePotential(in_stack_fffffffffffffbb0,(RealType)in_stack_fffffffffffffba8)
        ;
        break;
      case 0x74:
        Vector3<double>::Vector3((Vector3<double> *)0x17e93d);
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_190,0);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_190,1);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_190,2);
        *pdVar5 = RVar6;
        StuntDouble::setTrq(in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
        break;
      case 0x75:
        local_198 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        StuntDouble::setParticlePot(in_stack_fffffffffffffbb0,(RealType *)in_stack_fffffffffffffba8)
        ;
        break;
      case 0x76:
        Vector3<double>::Vector3((Vector3<double> *)0x17e3d6);
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_120,0);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_120,1);
        *pdVar5 = RVar6;
        RVar6 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        pdVar5 = Vector<double,_3U>::operator[](&local_120,2);
        *pdVar5 = RVar6;
        if ((*(byte *)(in_RDI + 0x251) & 1) != 0) {
          StuntDouble::setVel(in_stack_fffffffffffffbb0,(Vector3d *)in_stack_fffffffffffffba8);
        }
        break;
      case 0x77:
        local_1a8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbe0);
        bVar2 = StuntDouble::isAtom(local_b0);
        if (bVar2) {
          if (local_b0 != (StuntDouble *)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          bVar2 = Atom::isFluctuatingCharge((Atom *)0x17ec00);
          if (bVar2) {
            StuntDouble::setFlucQVel(in_stack_fffffffffffffbb0,(RealType)in_stack_fffffffffffffba8);
          }
        }
      }
    }
    bVar2 = StuntDouble::isRigidBody(local_b0);
    if (bVar2) {
      if ((*(byte *)(in_RDI + 0x250) & 1) != 0) {
        RigidBody::updateAtoms(in_stack_fffffffffffffd30);
      }
      if ((*(byte *)(in_RDI + 0x251) & 1) != 0) {
        RigidBody::updateAtomVel(in_stack_fffffffffffffec0);
      }
    }
    std::__cxx11::string::~string(local_d8);
    local_b4 = 0;
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffba0);
  return;
}

Assistant:

void DumpReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    size_t found;

    if (needPos_) {
      found = type.find("p");
      if (found == std::string::npos) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: StuntDouble %d has no Position\n"
                 "\tField (\"p\") specified.\n%s\n",
                 index, line.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }

    if (sd->isDirectional()) {
      if (needQuaternion_) {
        found = type.find("q");
        if (found == std::string::npos) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpReader Error: Directional StuntDouble %d has no\n"
                   "\tQuaternion Field (\"q\") specified.\n%s\n",
                   index, line.c_str());
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        Vector3d pos;
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        if (needPos_) { sd->setPos(pos); }
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        if (needVel_) { sd->setVel(vel); }
        break;
      }

      case 'q': {
        Quat4d q;
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not
            // equal to 0

            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpReader Error: initial quaternion error "
                     "(q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
          if (needQuaternion_) { sd->setQ(q); }
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
          if (needAngMom_) { sd->setJ(ji); }
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        sd->setFrc(force);
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        sd->setTrq(torque);
        break;
      }
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        // only set the field if we have allocated memory for it
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType density;
        density = tokenizer.nextTokenAsDouble();
        sd->setDensity(density);
        break;
      }

      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      if (needPos_) {
        // This should let us use various atom-based selections even
        // if we have only rigid bodies:
        rb->updateAtoms();
      }
      if (needVel_) { rb->updateAtomVel(); }
    }
  }